

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ScopeBegin(Parser *this)

{
  bool bVar1;
  char *local_18;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  bVar1 = VariableStackFrame::ScopeBegin(&this->m_variableStackFrame);
  if (!bVar1) {
    local_18 = VariableStackFrame::GetErrorMessage(&this->m_variableStackFrame);
    Error<char_const*>(this,"%s",&local_18);
  }
  EmitOpcode(this,ScopeBegin);
  return;
}

Assistant:

inline void Parser::ScopeBegin()
	{
		if (!m_variableStackFrame.ScopeBegin())
			Error("%s", m_variableStackFrame.GetErrorMessage());
		EmitOpcode(Opcode::ScopeBegin);
	}